

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O2

void __thiscall QDataWidgetMapper::setCurrentIndex(QDataWidgetMapper *this,int index)

{
  QDataWidgetMapperPrivate *this_00;
  QAbstractItemModel *pQVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long in_FS_OFFSET;
  QModelIndex local_60;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < index) {
    this_00 = *(QDataWidgetMapperPrivate **)(this + 8);
    iVar2 = QDataWidgetMapperPrivate::itemCount(this_00);
    if (index < iVar2) {
      pQVar1 = this_00->model;
      if (this_00->orientation == Horizontal) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&this_00->rootIndex);
        lVar3 = *(long *)pQVar1;
        iVar2 = 0;
        iVar4 = index;
      }
      else {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&this_00->rootIndex);
        lVar3 = *(long *)pQVar1;
        iVar4 = 0;
        iVar2 = index;
      }
      (**(code **)(lVar3 + 0x60))(&local_48,pQVar1,iVar4,iVar2,&local_60);
      QPersistentModelIndex::operator=(&this_00->currentTopLeft,&local_48);
      QDataWidgetMapperPrivate::populate(this_00);
      currentIndexChanged(this,index);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::setCurrentIndex(int index)
{
    Q_D(QDataWidgetMapper);

    if (index < 0 || index >= d->itemCount())
        return;
    d->currentTopLeft = d->orientation == Qt::Horizontal
                            ? d->model->index(index, 0, d->rootIndex)
                            : d->model->index(0, index, d->rootIndex);
    d->populate();

    emit currentIndexChanged(index);
}